

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O2

void __thiscall Privkey_TweakTest_Test::TestBody(Privkey_TweakTest_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_348;
  AssertionResult gtest_ar;
  string local_330;
  Privkey sk_a;
  Privkey sk_c1;
  Privkey sk_b;
  ByteData256 tweak;
  string exp_sk_m2;
  string exp_sk_m1;
  string exp_sk_c3;
  Privkey sk_c2;
  string exp_sk_c4;
  string exp_sk_c2;
  string exp_sk_c1;
  Privkey sk_m4;
  Privkey sk_m3;
  Privkey sk_c6;
  Privkey sk_c5;
  Privkey sk_m2;
  Privkey sk_m1;
  Privkey sk_c4;
  Privkey sk_c3;
  Pubkey pk_b;
  Pubkey pk_a;
  Privkey local_88;
  Privkey local_68;
  Privkey local_48;
  Privkey local_28;
  
  std::__cxx11::string::string
            ((string *)&sk_b,"1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434",
             (allocator *)&sk_c1);
  cfd::core::Privkey::Privkey(&sk_a,(string *)&sk_b,kMainnet,true);
  std::__cxx11::string::~string((string *)&sk_b);
  std::__cxx11::string::string
            ((string *)&sk_c1,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)&sk_c2);
  cfd::core::Privkey::Privkey(&sk_b,(string *)&sk_c1,kMainnet,true);
  std::__cxx11::string::~string((string *)&sk_c1);
  std::__cxx11::string::string
            ((string *)&sk_c1,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)&sk_c2);
  cfd::core::ByteData256::ByteData256(&tweak,(string *)&sk_c1);
  std::__cxx11::string::~string((string *)&sk_c1);
  cfd::core::Privkey::GetPubkey(&pk_a,&sk_a);
  cfd::core::Privkey::GetPubkey(&pk_b,&sk_b);
  cfd::core::operator+(&sk_c1,&sk_a,&sk_b);
  cfd::core::operator-(&sk_c2,&sk_a,&sk_b);
  cfd::core::operator+(&sk_c3,&sk_a,&tweak);
  cfd::core::operator-(&sk_c4,&sk_a,&tweak);
  cfd::core::operator*(&sk_m1,&sk_a,&sk_b);
  cfd::core::operator*(&sk_m2,&sk_a,&tweak);
  cfd::core::Privkey::Privkey(&sk_c5,&sk_a);
  cfd::core::Privkey::Privkey(&sk_c6,&sk_a);
  cfd::core::Privkey::operator+=(&local_28,&sk_c5,&sk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28);
  cfd::core::Privkey::operator+=(&local_48,&sk_c6,&tweak);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  cfd::core::Privkey::Privkey(&sk_m3,&sk_a);
  cfd::core::Privkey::Privkey(&sk_m4,&sk_a);
  cfd::core::Privkey::operator*=(&local_68,&sk_m3,&sk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  cfd::core::Privkey::operator*=(&local_88,&sk_m4,&tweak);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  std::__cxx11::string::string
            ((string *)&exp_sk_c1,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d"
             ,(allocator *)&exp_sk_c2);
  std::__cxx11::string::string
            ((string *)&exp_sk_c2,"e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c"
             ,(allocator *)&exp_sk_c3);
  std::__cxx11::string::string
            ((string *)&exp_sk_c3,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d"
             ,(allocator *)&exp_sk_c4);
  std::__cxx11::string::string
            ((string *)&exp_sk_c4,"e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c"
             ,(allocator *)&exp_sk_m1);
  std::__cxx11::string::string
            ((string *)&exp_sk_m1,"5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0"
             ,(allocator *)&exp_sk_m2);
  std::__cxx11::string::string
            ((string *)&exp_sk_m2,"5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0"
             ,(allocator *)&local_330);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_c1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c1","sk_c1.GetHex()",&exp_sk_c1,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x153,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_c2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c2","sk_c2.GetHex()",&exp_sk_c2,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x154,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_c3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c3","sk_c3.GetHex()",&exp_sk_c3,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x155,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_c4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c4","sk_c4.GetHex()",&exp_sk_c4,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x156,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_m1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_m1","sk_m1.GetHex()",&exp_sk_m1,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x157,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_m2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_m2","sk_m2.GetHex()",&exp_sk_m2,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x158,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_c5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c1","sk_c5.GetHex()",&exp_sk_c1,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15a,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_c6);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_c3","sk_c6.GetHex()",&exp_sk_c3,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15b,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_m3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_m1","sk_m3.GetHex()",&exp_sk_m1,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15c,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_330,&sk_m4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_sk_m2","sk_m4.GetHex()",&exp_sk_m2,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_330);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_348,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&AStack_348);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_330);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&exp_sk_m2);
  std::__cxx11::string::~string((string *)&exp_sk_m1);
  std::__cxx11::string::~string((string *)&exp_sk_c4);
  std::__cxx11::string::~string((string *)&exp_sk_c3);
  std::__cxx11::string::~string((string *)&exp_sk_c2);
  std::__cxx11::string::~string((string *)&exp_sk_c1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_m4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_m3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_m2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_m1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_a);
  return;
}

Assistant:

TEST(Privkey, TweakTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  ByteData256 tweak("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");

  auto pk_a = sk_a.GetPubkey();
  auto pk_b = sk_b.GetPubkey();

  auto sk_c1 = sk_a + sk_b;
  auto sk_c2 = sk_a - sk_b;
  auto sk_c3 = sk_a + tweak;
  auto sk_c4 = sk_a - tweak;
  auto sk_m1 = sk_a * sk_b;
  auto sk_m2 = sk_a * tweak;

  Privkey sk_c5 = sk_a;
  Privkey sk_c6 = sk_a;
  sk_c5 += sk_b;
  sk_c6 += tweak;

  Privkey sk_m3 = sk_a;
  Privkey sk_m4 = sk_a;
  sk_m3 *= sk_b;
  sk_m4 *= tweak;

  std::string exp_sk_c1 = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_sk_c2 = "e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c";
  std::string exp_sk_c3 = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_sk_c4 = "e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c";
  std::string exp_sk_m1 = "5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0";
  std::string exp_sk_m2 = "5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0";

  EXPECT_EQ(exp_sk_c1, sk_c1.GetHex());
  EXPECT_EQ(exp_sk_c2, sk_c2.GetHex());
  EXPECT_EQ(exp_sk_c3, sk_c3.GetHex());
  EXPECT_EQ(exp_sk_c4, sk_c4.GetHex());
  EXPECT_EQ(exp_sk_m1, sk_m1.GetHex());
  EXPECT_EQ(exp_sk_m2, sk_m2.GetHex());

  EXPECT_EQ(exp_sk_c1, sk_c5.GetHex());
  EXPECT_EQ(exp_sk_c3, sk_c6.GetHex());
  EXPECT_EQ(exp_sk_m1, sk_m3.GetHex());
  EXPECT_EQ(exp_sk_m2, sk_m4.GetHex());
}